

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::sse42::InstanceArrayIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCFormat RVar3;
  InstanceArray *this;
  RTCRayQueryContext *pRVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  Accel *pAVar7;
  ulong uVar8;
  long lVar9;
  uint auVar10 [1];
  float fVar11;
  uint auVar17 [1];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar19;
  float fVar20;
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  vfloat4 l02;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  float fVar32;
  undefined1 auVar33 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar42;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 in_XMM11 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 in_XMM12 [16];
  float fVar53;
  float fVar54;
  RayQueryContext newcontext;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  RTCRayQueryContext RVar12;
  undefined1 auVar23 [16];
  
  auVar33 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar7 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (((pAVar7 != (Accel *)0x0) && (((ray->super_RayK<1>).mask & (this->super_Geometry).mask) != 0))
     && (pRVar4 = context->user, pRVar4->instID[0] == 0xffffffff)) {
    auVar10[0] = (*prim).primID_;
    auVar17[0] = (*prim).instID_;
    RVar12.instPrimID[0] = auVar10[0];
    RVar12.instID[0] = auVar17[0];
    auVar14._8_8_ = 0;
    auVar14._0_4_ = (float)auVar17[0];
    auVar14._4_4_ = (float)auVar10[0];
    *pRVar4 = RVar12;
    uVar8 = (ulong)prim->primID_;
    pRVar5 = (this->l2w_buf).items;
    RVar3 = pRVar5->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = uVar8 * pRVar5->stride;
        auVar14 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9)),*(undefined4 *)(pcVar6 + lVar9 + 0x10)
                           ,0x1c);
        auVar14 = insertps(auVar14,*(undefined4 *)(pcVar6 + lVar9 + 0x20),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 4)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x14),0x1c);
        in_XMM12 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x24),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 8)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x18),0x1c);
        in_XMM11 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x28),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x1c),0x1c);
        in_XMM1 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x2c),0x28);
      }
      else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = uVar8 * pRVar5->stride;
        auVar14._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 4);
        auVar14._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9);
        auVar14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 4) >> 0x20);
        auVar14._12_4_ = 0.0;
        in_XMM12._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x10);
        in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0xc);
        in_XMM12._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x10) >> 0x20);
        in_XMM12._12_4_ = 0;
        in_XMM11._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
        in_XMM11._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
        in_XMM11._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
        in_XMM11._12_4_ = 0;
        in_XMM1._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x28);
        in_XMM1._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x24);
        in_XMM1._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x28) >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = uVar8 * pRVar5->stride;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = *(ulong *)(pcVar6 + lVar9 + 0x10);
        auVar51 = insertps(auVar51,*(undefined4 *)(pcVar6 + lVar9 + 8),0x20);
        auVar29._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x34);
        auVar29._0_4_ = *(undefined4 *)(pcVar6 + lVar9);
        auVar29._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x34) >> 0x20);
        auVar29._12_4_ = 0;
        auVar25._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
        auVar25._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
        auVar25._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
        auVar25._12_4_ = 0;
        fVar11 = *(float *)(pcVar6 + lVar9 + 0x24);
        fVar26 = *(float *)(pcVar6 + lVar9 + 0x28);
        fVar32 = *(float *)(pcVar6 + lVar9 + 0x2c);
        fVar19 = *(float *)(pcVar6 + lVar9 + 0x30);
        fVar35 = fVar19 * fVar19 + fVar32 * fVar32 + fVar11 * fVar11 + fVar26 * fVar26;
        auVar14 = rsqrtss(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
        fVar20 = auVar14._0_4_;
        auVar44._4_12_ = auVar14._4_12_;
        fVar20 = fVar20 * fVar20 * fVar35 * -0.5 * fVar20 + fVar20 * 1.5;
        in_XMM1 = insertps(auVar25,ZEXT416((uint)(fVar11 * fVar20)),0x30);
        auVar14 = insertps(auVar29,ZEXT416((uint)(fVar26 * fVar20)),0x30);
        auVar44._0_4_ = fVar20 * fVar19;
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                           *(undefined4 *)(pcVar6 + lVar9 + 4),0x10);
        in_XMM11 = insertps(auVar51,auVar44,0x30);
        auVar29 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x3c),0x20);
        in_XMM12 = insertps(auVar29,ZEXT416((uint)(fVar32 * fVar20)),0x30);
      }
      else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = uVar8 * pRVar5->stride;
        auVar14 = *(undefined1 (*) [16])(pcVar6 + lVar9);
        in_XMM12 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x10);
        in_XMM11 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x20);
        in_XMM1 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x30);
      }
      fVar32 = in_XMM1._12_4_;
      fVar11 = auVar14._0_4_;
      fVar26 = auVar14._12_4_;
      fVar42 = in_XMM12._0_4_;
      fVar45 = in_XMM12._4_4_;
      fVar41 = in_XMM12._12_4_;
      fVar37 = in_XMM11._0_4_;
      fVar39 = in_XMM11._4_4_;
      fVar40 = in_XMM11._8_4_;
      fVar36 = in_XMM11._12_4_;
      fVar35 = fVar26 * fVar41 + fVar36 * fVar32;
      fVar19 = fVar26 * fVar41 - fVar36 * fVar32;
      fVar20 = fVar32 * fVar32 + fVar26 * fVar26 + -fVar41 * fVar41 + -fVar36 * fVar36;
      fVar53 = fVar32 * fVar32 - fVar26 * fVar26;
      fVar50 = fVar41 * fVar41 + fVar53 + -fVar36 * fVar36;
      fVar54 = fVar26 * fVar36 - fVar41 * fVar32;
      fVar38 = fVar41 * fVar32 + fVar26 * fVar36;
      fVar52 = fVar41 * fVar36 + fVar26 * fVar32;
      fVar26 = fVar41 * fVar36 - fVar26 * fVar32;
      fVar35 = fVar35 + fVar35;
      fVar54 = fVar54 + fVar54;
      fVar32 = fVar36 * fVar36 + fVar53 + -fVar41 * fVar41;
      fVar53 = fVar20 * 1.0 + fVar35 * 0.0 + fVar54 * 0.0;
      fVar46 = fVar20 * 0.0 + fVar35 * 1.0 + fVar54 * 0.0;
      fVar48 = fVar20 * 0.0 + fVar35 * 0.0 + fVar54 * 1.0;
      fVar54 = fVar20 * 0.0 + fVar35 * 0.0 + fVar54 * 0.0;
      fVar52 = fVar52 + fVar52;
      fVar19 = fVar19 + fVar19;
      fVar20 = fVar19 * 1.0 + fVar50 * 0.0 + fVar52 * 0.0;
      fVar35 = fVar19 * 0.0 + fVar50 * 1.0 + fVar52 * 0.0;
      fVar36 = fVar19 * 0.0 + fVar50 * 0.0 + fVar52 * 1.0;
      fVar19 = fVar19 * 0.0 + fVar50 * 0.0 + fVar52 * 0.0;
      auVar49._0_8_ = auVar14._4_8_;
      auVar49._8_8_ = 0;
      auVar29 = blendps(auVar49,in_XMM12,4);
      fVar38 = fVar38 + fVar38;
      fVar26 = fVar26 + fVar26;
      fVar50 = fVar38 * 1.0 + fVar26 * 0.0 + fVar32 * 0.0;
      fVar52 = fVar38 * 0.0 + fVar26 * 1.0 + fVar32 * 0.0;
      fVar41 = fVar38 * 0.0 + fVar26 * 0.0 + fVar32 * 1.0;
      fVar32 = fVar38 * 0.0 + fVar26 * 0.0 + fVar32 * 0.0;
      local_68._0_4_ = in_XMM1._0_4_;
      local_68._4_4_ = in_XMM1._4_4_;
      uStack_60._0_4_ = in_XMM1._8_4_;
      fVar26 = fVar32 * 0.0;
      auVar14._0_4_ = fVar11 * fVar53 + fVar20 * 0.0 + fVar50 * 0.0;
      auVar14._4_4_ = fVar11 * fVar46 + fVar35 * 0.0 + fVar52 * 0.0;
      auVar14._8_4_ = fVar11 * fVar48 + fVar36 * 0.0 + fVar41 * 0.0;
      auVar14._12_4_ = fVar11 * fVar54 + fVar19 * 0.0 + fVar26;
      in_XMM7._0_4_ = fVar42 * fVar53 + fVar45 * fVar20 + fVar50 * 0.0;
      in_XMM7._4_4_ = fVar42 * fVar46 + fVar45 * fVar35 + fVar52 * 0.0;
      in_XMM7._8_4_ = fVar42 * fVar48 + fVar45 * fVar36 + fVar41 * 0.0;
      in_XMM7._12_4_ = fVar42 * fVar54 + fVar45 * fVar19 + fVar26;
      in_XMM4._0_4_ = fVar37 * fVar53 + fVar39 * fVar20 + fVar40 * fVar50;
      in_XMM4._4_4_ = fVar37 * fVar46 + fVar39 * fVar35 + fVar40 * fVar52;
      in_XMM4._8_4_ = fVar37 * fVar48 + fVar39 * fVar36 + fVar40 * fVar41;
      in_XMM4._12_4_ = fVar37 * fVar54 + fVar39 * fVar19 + fVar40 * fVar32;
      auVar33._0_4_ =
           (float)local_68 * fVar53 + local_68._4_4_ * fVar20 + (float)uStack_60 * fVar50 +
           auVar29._0_4_ + 0.0;
      auVar33._4_4_ =
           (float)local_68 * fVar46 + local_68._4_4_ * fVar35 + (float)uStack_60 * fVar52 +
           auVar29._4_4_ + 0.0;
      auVar33._8_4_ =
           (float)local_68 * fVar48 + local_68._4_4_ * fVar36 + (float)uStack_60 * fVar41 +
           auVar29._8_4_ + 0.0;
    }
    else if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = uVar8 * pRVar5->stride;
      auVar14 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9)),*(undefined4 *)(pcVar6 + lVar9 + 0x10),
                         0x1c);
      auVar14 = insertps(auVar14,*(undefined4 *)(pcVar6 + lVar9 + 0x20),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 4)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x14),0x1c);
      in_XMM7 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x24),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 8)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x18),0x1c);
      in_XMM4 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x28),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x1c),0x1c);
      auVar29 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x2c),0x28);
      auVar33 = auVar29._0_12_;
    }
    else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = uVar8 * pRVar5->stride;
      auVar14._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 4);
      auVar14._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9);
      auVar14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 4) >> 0x20);
      auVar14._12_4_ = 0.0;
      in_XMM7._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x10);
      in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0xc);
      in_XMM7._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x10) >> 0x20);
      in_XMM7._12_4_ = 0.0;
      in_XMM4._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
      in_XMM4._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0x18);
      in_XMM4._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
      in_XMM4._12_4_ = 0.0;
      auVar33._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x28);
      auVar33._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0x24);
      auVar33._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x28) >> 0x20);
    }
    else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = uVar8 * pRVar5->stride;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(pcVar6 + lVar9 + 0x10);
      auVar29 = insertps(auVar27,*(undefined4 *)(pcVar6 + lVar9 + 8),0x20);
      auVar13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x34);
      auVar13._0_4_ = *(undefined4 *)(pcVar6 + lVar9);
      auVar13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x34) >> 0x20);
      auVar13._12_4_ = 0;
      auVar34._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
      auVar34._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
      auVar34._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
      auVar34._12_4_ = 0;
      fVar11 = *(float *)(pcVar6 + lVar9 + 0x24);
      fVar26 = *(float *)(pcVar6 + lVar9 + 0x28);
      fVar32 = *(float *)(pcVar6 + lVar9 + 0x2c);
      fVar19 = *(float *)(pcVar6 + lVar9 + 0x30);
      fVar35 = fVar19 * fVar19 + fVar32 * fVar32 + fVar11 * fVar11 + fVar26 * fVar26;
      auVar14 = rsqrtss(ZEXT416((uint)fVar35),ZEXT416((uint)fVar35));
      fVar20 = auVar14._0_4_;
      auVar43._4_12_ = auVar14._4_12_;
      fVar20 = fVar20 * fVar20 * fVar35 * -0.5 * fVar20 + fVar20 * 1.5;
      auVar14 = insertps(auVar34,ZEXT416((uint)(fVar11 * fVar20)),0x30);
      auVar33 = auVar14._0_12_;
      auVar14 = insertps(auVar13,ZEXT416((uint)(fVar26 * fVar20)),0x30);
      auVar43._0_4_ = fVar20 * fVar19;
      auVar25 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                         *(undefined4 *)(pcVar6 + lVar9 + 4),0x10);
      in_XMM4 = insertps(auVar29,auVar43,0x30);
      auVar29 = insertps(auVar25,*(undefined4 *)(pcVar6 + lVar9 + 0x3c),0x20);
      in_XMM7 = insertps(auVar29,ZEXT416((uint)(fVar32 * fVar20)),0x30);
    }
    else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = uVar8 * pRVar5->stride;
      auVar14 = *(undefined1 (*) [16])(pcVar6 + lVar9);
      in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x10);
      in_XMM4 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x20);
      auVar33 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar9 + 0x30),0);
    }
    fVar35 = in_XMM4._0_4_;
    fVar36 = in_XMM4._4_4_;
    fVar38 = in_XMM4._8_4_;
    fVar50 = in_XMM4._12_4_;
    fVar52 = in_XMM7._0_4_;
    fVar41 = in_XMM7._4_4_;
    fVar53 = in_XMM7._8_4_;
    fVar11 = auVar14._0_4_;
    fVar26 = auVar14._4_4_;
    fVar32 = auVar14._8_4_;
    auVar18._0_4_ = fVar52 * fVar36 - fVar41 * fVar35;
    fVar19 = fVar41 * fVar38 - fVar53 * fVar36;
    fVar20 = fVar53 * fVar35 - fVar52 * fVar38;
    auVar21._4_4_ = fVar20;
    auVar21._0_4_ = fVar19;
    auVar21._8_4_ = auVar18._0_4_;
    auVar21._12_4_ = in_XMM7._12_4_ * fVar50 - in_XMM7._12_4_ * fVar50;
    auVar28._0_4_ = fVar35 * fVar26 - fVar36 * fVar11;
    auVar28._4_4_ = fVar36 * fVar32 - fVar38 * fVar26;
    auVar28._8_4_ = fVar38 * fVar11 - fVar35 * fVar32;
    auVar28._12_4_ = fVar50 * auVar14._12_4_ - fVar50 * auVar14._12_4_;
    fVar35 = fVar26 * fVar53 - fVar32 * fVar41;
    auVar14 = dpps(auVar14,auVar21,0x7f);
    auVar29 = insertps(auVar28,auVar28,0x4a);
    auVar18._4_4_ = auVar28._0_4_;
    auVar18._8_4_ = fVar11 * fVar41 - fVar26 * fVar52;
    auVar18._12_4_ = 0;
    auVar24._4_4_ = fVar35;
    auVar24._0_4_ = fVar19;
    auVar24._8_4_ = fVar35;
    auVar24._12_4_ = auVar29._4_4_;
    auVar23._8_8_ = auVar24._8_8_;
    auVar23._4_4_ = auVar29._0_4_;
    auVar23._0_4_ = fVar19;
    auVar22._4_4_ = auVar29._8_4_;
    auVar22._0_4_ = fVar20;
    auVar22._8_4_ = fVar32 * fVar52 - fVar11 * fVar53;
    auVar22._12_4_ = auVar29._12_4_;
    auVar15._0_4_ = auVar14._0_4_;
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar15._0_4_;
    auVar15._12_4_ = auVar15._0_4_;
    auVar25 = divps(auVar23,auVar15);
    auVar29 = divps(auVar22,auVar15);
    auVar14 = divps(auVar18,auVar15);
    fVar46 = auVar33._0_4_;
    fVar48 = auVar33._4_4_;
    fVar54 = auVar33._8_4_;
    fVar11 = auVar14._0_4_;
    fVar26 = auVar14._4_4_;
    fVar32 = auVar14._8_4_;
    fVar19 = auVar14._12_4_;
    fVar20 = auVar29._0_4_;
    fVar35 = auVar29._4_4_;
    fVar36 = auVar29._8_4_;
    fVar38 = auVar29._12_4_;
    fVar50 = auVar25._0_4_;
    fVar52 = auVar25._4_4_;
    fVar41 = auVar25._8_4_;
    fVar53 = auVar25._12_4_;
    aVar1 = (ray->super_RayK<1>).org.field_0.field_1;
    fVar37 = aVar1.x;
    fVar39 = aVar1.y;
    fVar40 = aVar1.z;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar42 = aVar2.x;
    fVar45 = aVar2.y;
    fVar47 = aVar2.z;
    auVar30._0_4_ =
         fVar37 * fVar50 +
         fVar39 * fVar20 + (fVar40 * fVar11 - (fVar46 * fVar50 + fVar48 * fVar20 + fVar54 * fVar11))
    ;
    auVar30._4_4_ =
         fVar37 * fVar52 +
         fVar39 * fVar35 + (fVar40 * fVar26 - (fVar46 * fVar52 + fVar48 * fVar35 + fVar54 * fVar26))
    ;
    auVar30._8_4_ =
         fVar37 * fVar41 +
         fVar39 * fVar36 + (fVar40 * fVar32 - (fVar46 * fVar41 + fVar48 * fVar36 + fVar54 * fVar32))
    ;
    auVar30._12_4_ =
         fVar37 * fVar53 +
         fVar39 * fVar38 + (fVar40 * fVar19 - (fVar46 * fVar53 + fVar48 * fVar38 + fVar54 * fVar19))
    ;
    aVar31.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar30,aVar1,8);
    (ray->super_RayK<1>).org.field_0 = aVar31;
    auVar16._0_4_ = fVar42 * fVar50 + fVar45 * fVar20 + fVar47 * fVar11;
    auVar16._4_4_ = fVar42 * fVar52 + fVar45 * fVar35 + fVar47 * fVar26;
    auVar16._8_4_ = fVar42 * fVar41 + fVar45 * fVar36 + fVar47 * fVar32;
    auVar16._12_4_ = fVar42 * fVar53 + fVar45 * fVar38 + fVar47 * fVar19;
    aVar31.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar16,aVar2,8);
    (ray->super_RayK<1>).dir.field_0 = aVar31;
    (**(code **)&pAVar7->field_0x78)(&(pAVar7->super_AccelData).field_0x58,ray);
    local_68 = aVar1._0_8_;
    uStack_60 = aVar1._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_68;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_60;
    local_58 = aVar2._0_8_;
    uStack_50 = aVar2._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_58;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_50;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif

      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }